

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O3

int anon_unknown.dwarf_7972ae::lh_char_call_cmp_func(lhash_cmp_func func,void *a,void *b)

{
  int iVar1;
  
  iVar1 = (*func)(a,b);
  return iVar1;
}

Assistant:

static std::unique_ptr<char[]> RandString(void) {
  unsigned len = 1 + (rand() % 3);
  auto ret = std::make_unique<char[]>(len + 1);

  for (unsigned i = 0; i < len; i++) {
    ret[i] = '0' + (rand() & 7);
  }
  ret[len] = 0;

  return ret;
}